

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_o1.cc
# Opt level: O0

vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
* __thiscall
lf::geometry::QuadO1::ChildGeometry
          (vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
           *__return_storage_ptr__,QuadO1 *this,RefinementPattern *ref_pat,dim_t codim)

{
  RefElType RVar1;
  RefElType RVar2;
  size_type sVar3;
  uint uVar4;
  ostream *poVar5;
  runtime_error *prVar6;
  size_type sVar7;
  reference pvVar8;
  Index IVar9;
  string local_1178;
  allocator<char> local_1151;
  string local_1150;
  allocator<char> local_1129;
  string local_1128;
  stringstream local_1108 [8];
  stringstream ss_7;
  ostream local_10f8 [376];
  undefined1 local_f80 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_f78;
  string local_f70;
  allocator<char> local_f49;
  string local_f48;
  allocator<char> local_f21;
  string local_f20;
  stringstream local_f00 [8];
  stringstream ss_6;
  ostream local_ef0 [376];
  undefined1 local_d78 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_d70;
  string local_d68;
  allocator<char> local_d41;
  string local_d40;
  allocator<char> local_d19;
  string local_d18;
  stringstream local_cf8 [8];
  stringstream ss_5;
  ostream local_ce8 [376];
  string local_b70;
  allocator<char> local_b49;
  string local_b48;
  allocator<char> local_b21;
  string local_b20;
  stringstream local_b00 [8];
  stringstream ss_4;
  ostream local_af0 [376];
  undefined1 local_978 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_970;
  undefined1 local_968 [8];
  unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> local_960;
  Type local_958;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
  local_948;
  Matrix<double,__1,__1,_0,__1,__1> local_910;
  undefined1 local_8f8 [8];
  MatrixXd child_geo;
  allocator<char> local_8b9;
  string local_8b8;
  allocator<char> local_891;
  string local_890;
  stringstream local_870 [8];
  stringstream ss_3;
  ostream local_860 [376];
  uint local_6e8;
  undefined1 local_6e2;
  allocator<char> local_6e1;
  int l;
  allocator<char> local_6b9;
  string local_6b8;
  allocator<char> local_691;
  string local_690;
  string local_670;
  allocator<char> local_649;
  string local_648;
  allocator<char> local_621;
  string local_620;
  stringstream local_600 [8];
  stringstream ss_2;
  ostream local_5f0 [380];
  uint local_474;
  vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
  local_470 [4];
  size_type no_children;
  vector<Eigen::Matrix<int,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>
  child_polygons;
  double local_458;
  double h_lattice;
  allocator<char> local_429;
  string local_428;
  allocator<char> local_401;
  string local_400;
  stringstream local_3e0 [8];
  stringstream ss_1;
  ostream local_3d0 [376];
  string local_258;
  allocator<char> local_231;
  string local_230;
  allocator<char> local_209;
  string local_208;
  RefEl local_1e1;
  string local_1e0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [378];
  RefEl local_26;
  RefEl local_25;
  dim_t local_24;
  RefinementPattern *pRStack_20;
  dim_t codim_local;
  RefinementPattern *ref_pat_local;
  QuadO1 *this_local;
  vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  *child_geo_uptrs;
  
  local_24 = codim;
  pRStack_20 = ref_pat;
  ref_pat_local = (RefinementPattern *)this;
  this_local = (QuadO1 *)__return_storage_ptr__;
  local_25 = RefinementPattern::RefEl(ref_pat);
  RVar1 = lf::base::RefEl::operator_cast_to_RefElType(&local_25);
  local_26 = lf::base::RefEl::kQuad();
  RVar2 = lf::base::RefEl::operator_cast_to_RefElType(&local_26);
  if (RVar1 != RVar2) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar5 = std::operator<<(local_1a0,"Refinement pattern for ");
    local_1e1 = RefinementPattern::RefEl(pRStack_20);
    lf::base::RefEl::ToString_abi_cxx11_(&local_1e0,&local_1e1);
    std::operator<<(poVar5,(string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"ref_pat.RefEl() == lf::base::RefEl::kQuad()",&local_209);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
               ,&local_231);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_208,&local_230,0xb9,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator(&local_231);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator(&local_209);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"this code should not be reached");
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (2 < local_24) {
    std::__cxx11::stringstream::stringstream(local_3e0);
    poVar5 = std::operator<<(local_3d0,"Illegal codim ");
    std::ostream::operator<<(poVar5,local_24);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_400,"codim < 3",&local_401);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_428,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
               ,&local_429);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_400,&local_428,0xbc,(string *)&h_lattice);
    std::__cxx11::string::~string((string *)&h_lattice);
    std::__cxx11::string::~string((string *)&local_428);
    std::allocator<char>::~allocator(&local_429);
    std::__cxx11::string::~string((string *)&local_400);
    std::allocator<char>::~allocator(&local_401);
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar6,"this code should not be reached");
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar3 = RefinementPattern::LatticeConst(pRStack_20);
  local_458 = 1.0 / (double)sVar3;
  (**(code **)(*(long *)pRStack_20 + 8))(local_470,pRStack_20,local_24);
  sVar7 = std::
          vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
          ::size(local_470);
  local_474 = (uint)sVar7;
  uVar4 = (*(code *)**(undefined8 **)pRStack_20)();
  if ((uint)sVar7 != uVar4) {
    std::__cxx11::stringstream::stringstream(local_600);
    poVar5 = std::operator<<(local_5f0,"no_children = ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_474);
    poVar5 = std::operator<<(poVar5," <-> ");
    uVar4 = (*(code *)**(undefined8 **)pRStack_20)(pRStack_20,local_24);
    std::ostream::operator<<(poVar5,uVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_620,"no_children == ref_pat.NumChildren(codim)",&local_621);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_648,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
               ,&local_649);
    std::__cxx11::stringstream::str();
    lf::base::AssertionFailed(&local_620,&local_648,200,&local_670);
    std::__cxx11::string::~string((string *)&local_670);
    std::__cxx11::string::~string((string *)&local_648);
    std::allocator<char>::~allocator(&local_649);
    std::__cxx11::string::~string((string *)&local_620);
    std::allocator<char>::~allocator(&local_621);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_690,"false",&local_691);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6b8,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
               ,&local_6b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&l,"",&local_6e1);
    lf::base::AssertionFailed(&local_690,&local_6b8,200,(string *)&l);
    std::__cxx11::string::~string((string *)&l);
    std::allocator<char>::~allocator(&local_6e1);
    std::__cxx11::string::~string((string *)&local_6b8);
    std::allocator<char>::~allocator(&local_6b9);
    std::__cxx11::string::~string((string *)&local_690);
    std::allocator<char>::~allocator(&local_691);
    abort();
  }
  local_6e2 = 0;
  memset(__return_storage_ptr__,0,0x18);
  std::
  vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
  ::vector(__return_storage_ptr__);
  local_6e8 = 0;
  do {
    if (local_474 <= local_6e8) {
      local_6e2 = 1;
      std::
      vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
      ::~vector(local_470);
      return __return_storage_ptr__;
    }
    pvVar8 = std::
             vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
             ::operator[](local_470,(long)(int)local_6e8);
    IVar9 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::rows
                      ((PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *)pvVar8);
    if (IVar9 != 2) {
      std::__cxx11::stringstream::stringstream(local_870);
      poVar5 = std::operator<<(local_860,"child_polygons[");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_6e8);
      poVar5 = std::operator<<(poVar5,"].rows() = ");
      pvVar8 = std::
               vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
               ::operator[](local_470,(long)(int)local_6e8);
      IVar9 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::rows
                        ((PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *)pvVar8);
      std::ostream::operator<<(poVar5,IVar9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_890,"child_polygons[l].rows() == 2",&local_891);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_8b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
                 ,&local_8b9);
      std::__cxx11::stringstream::str();
      lf::base::AssertionFailed
                (&local_890,&local_8b8,0xd2,
                 (string *)
                 &child_geo.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_cols);
      std::__cxx11::string::~string
                ((string *)
                 &child_geo.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_cols);
      std::__cxx11::string::~string((string *)&local_8b8);
      std::allocator<char>::~allocator(&local_8b9);
      std::__cxx11::string::~string((string *)&local_890);
      std::allocator<char>::~allocator(&local_891);
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar6,"this code should not be reached");
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pvVar8 = std::
             vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
             ::operator[](local_470,(long)(int)local_6e8);
    Eigen::DenseBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cast<double>
              (&local_958,(DenseBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *)pvVar8);
    Eigen::operator*(&local_948,&local_458,(StorageBaseType *)&local_958);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,double>,Eigen::Matrix<int,_1,_1,0,_1,_1>const>const>>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_910,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_cast_op<int,_double>,_const_Eigen::Matrix<int,__1,__1,_0,__1,__1>_>_>_>
                *)&local_948);
    (*(this->super_Geometry)._vptr_Geometry[3])(local_8f8,this,&local_910);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_910);
    if (local_24 == 0) {
      pvVar8 = std::
               vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
               ::operator[](local_470,(long)(int)local_6e8);
      IVar9 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cols
                        ((PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *)pvVar8);
      if (IVar9 == 3) {
        std::make_unique<lf::geometry::TriaO1,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                  ((Matrix<double,__1,__1,_0,__1,__1> *)local_968);
        std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
        unique_ptr<lf::geometry::TriaO1,std::default_delete<lf::geometry::TriaO1>,void>
                  ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *
                   )&local_960,
                   (unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_> *)
                   local_968);
        std::
        vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)&local_960);
        std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
        ~unique_ptr(&local_960);
        std::unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_>::
        ~unique_ptr((unique_ptr<lf::geometry::TriaO1,_std::default_delete<lf::geometry::TriaO1>_> *)
                    local_968);
      }
      else {
        pvVar8 = std::
                 vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
                 ::operator[](local_470,(long)(int)local_6e8);
        IVar9 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cols
                          ((PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *)pvVar8);
        if (IVar9 != 4) {
          std::__cxx11::stringstream::stringstream(local_b00);
          poVar5 = std::operator<<(local_af0,"child_polygons[");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_6e8);
          poVar5 = std::operator<<(poVar5,"].cols() = ");
          pvVar8 = std::
                   vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
                   ::operator[](local_470,(long)(int)local_6e8);
          IVar9 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cols
                            ((PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *)pvVar8);
          std::ostream::operator<<(poVar5,IVar9);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b20,"false",&local_b21);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b48,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
                     ,&local_b49);
          std::__cxx11::stringstream::str();
          lf::base::AssertionFailed(&local_b20,&local_b48,0xe2,&local_b70);
          std::__cxx11::string::~string((string *)&local_b70);
          std::__cxx11::string::~string((string *)&local_b48);
          std::allocator<char>::~allocator(&local_b49);
          std::__cxx11::string::~string((string *)&local_b20);
          std::allocator<char>::~allocator(&local_b21);
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar6,"this code should not be reached");
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::make_unique<lf::geometry::QuadO1,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                  ((Matrix<double,__1,__1,_0,__1,__1> *)local_978);
        std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
        unique_ptr<lf::geometry::QuadO1,std::default_delete<lf::geometry::QuadO1>,void>
                  ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *
                   )&local_970,
                   (unique_ptr<lf::geometry::QuadO1,_std::default_delete<lf::geometry::QuadO1>_> *)
                   local_978);
        std::
        vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)&local_970);
        std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
        ~unique_ptr(&local_970);
        std::unique_ptr<lf::geometry::QuadO1,_std::default_delete<lf::geometry::QuadO1>_>::
        ~unique_ptr((unique_ptr<lf::geometry::QuadO1,_std::default_delete<lf::geometry::QuadO1>_> *)
                    local_978);
      }
    }
    else if (local_24 == 1) {
      pvVar8 = std::
               vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
               ::operator[](local_470,(long)(int)local_6e8);
      IVar9 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cols
                        ((PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *)pvVar8);
      if (IVar9 != 2) {
        std::__cxx11::stringstream::stringstream(local_cf8);
        poVar5 = std::operator<<(local_ce8,"child_polygons[l].cols() = ");
        pvVar8 = std::
                 vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
                 ::operator[](local_470,(long)(int)local_6e8);
        IVar9 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cols
                          ((PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *)pvVar8);
        std::ostream::operator<<(poVar5,IVar9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d18,"child_polygons[l].cols() == 2",&local_d19);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d40,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
                   ,&local_d41);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_d18,&local_d40,0xea,&local_d68);
        std::__cxx11::string::~string((string *)&local_d68);
        std::__cxx11::string::~string((string *)&local_d40);
        std::allocator<char>::~allocator(&local_d41);
        std::__cxx11::string::~string((string *)&local_d18);
        std::allocator<char>::~allocator(&local_d19);
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar6,"this code should not be reached");
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::make_unique<lf::geometry::SegmentO1,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_d78);
      std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
      unique_ptr<lf::geometry::SegmentO1,std::default_delete<lf::geometry::SegmentO1>,void>
                ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
                 &local_d70,
                 (unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>
                  *)local_d78);
      std::
      vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&local_d70);
      std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
      ~unique_ptr(&local_d70);
      std::unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>::
      ~unique_ptr((unique_ptr<lf::geometry::SegmentO1,_std::default_delete<lf::geometry::SegmentO1>_>
                   *)local_d78);
    }
    else {
      if (local_24 != 2) {
        std::__cxx11::stringstream::stringstream(local_1108);
        std::operator<<(local_10f8,"Illegal co-dimension");
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1128,"false",&local_1129);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1150,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
                   ,&local_1151);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_1128,&local_1150,0xf6,&local_1178);
        std::__cxx11::string::~string((string *)&local_1178);
        std::__cxx11::string::~string((string *)&local_1150);
        std::allocator<char>::~allocator(&local_1151);
        std::__cxx11::string::~string((string *)&local_1128);
        std::allocator<char>::~allocator(&local_1129);
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar6,"this code should not be reached");
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pvVar8 = std::
               vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
               ::operator[](local_470,(long)(int)local_6e8);
      IVar9 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cols
                        ((PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *)pvVar8);
      if (IVar9 != 1) {
        std::__cxx11::stringstream::stringstream(local_f00);
        poVar5 = std::operator<<(local_ef0,"child_polygons[l].cols() = ");
        pvVar8 = std::
                 vector<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>_>
                 ::operator[](local_470,(long)(int)local_6e8);
        IVar9 = Eigen::PlainObjectBase<Eigen::Matrix<int,_-1,_-1,_0,_-1,_-1>_>::cols
                          ((PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_> *)pvVar8);
        std::ostream::operator<<(poVar5,IVar9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f20,"child_polygons[l].cols() == 1",&local_f21);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f48,
                   "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/quad_o1.cc"
                   ,&local_f49);
        std::__cxx11::stringstream::str();
        lf::base::AssertionFailed(&local_f20,&local_f48,0xf1,&local_f70);
        std::__cxx11::string::~string((string *)&local_f70);
        std::__cxx11::string::~string((string *)&local_f48);
        std::allocator<char>::~allocator(&local_f49);
        std::__cxx11::string::~string((string *)&local_f20);
        std::allocator<char>::~allocator(&local_f21);
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar6,"this code should not be reached");
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::make_unique<lf::geometry::Point,Eigen::Matrix<double,_1,_1,0,_1,_1>const&>
                ((Matrix<double,__1,__1,_0,__1,__1> *)local_f80);
      std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
      unique_ptr<lf::geometry::Point,std::default_delete<lf::geometry::Point>,void>
                ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
                 &local_f78,
                 (unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)
                 local_f80);
      std::
      vector<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
      ::push_back(__return_storage_ptr__,(value_type *)&local_f78);
      std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>::
      ~unique_ptr(&local_f78);
      std::unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_>::~unique_ptr
                ((unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)
                 local_f80);
    }
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix
              ((Matrix<double,__1,__1,_0,__1,__1> *)local_8f8);
    local_6e8 = local_6e8 + 1;
  } while( true );
}

Assistant:

std::vector<std::unique_ptr<Geometry>> QuadO1::ChildGeometry(
    const RefinementPattern& ref_pat, base::dim_t codim) const {
  // The refinement pattern must be for a quadrilateral
  LF_VERIFY_MSG(ref_pat.RefEl() == lf::base::RefEl::kQuad(),
                "Refinement pattern for " << ref_pat.RefEl().ToString());
  // Allowed condimensions:
  // 0 -> child cells, 1-> child edges, 2 -> child points
  LF_VERIFY_MSG(codim < 3, "Illegal codim " << codim);

  // Lattice meshwidth
  const double h_lattice = 1.0 / static_cast<double>(ref_pat.LatticeConst());
  // Obtain geometry of children as lattice polygons
  std::vector<Eigen::Matrix<int, Eigen::Dynamic, Eigen::Dynamic>>
      child_polygons(ref_pat.ChildPolygons(codim));
  // Number of child segments
  const base::size_type no_children = child_polygons.size();
  // Check consistency of data
  LF_ASSERT_MSG(
      no_children == ref_pat.NumChildren(codim),
      "no_children = " << no_children << " <-> " << ref_pat.NumChildren(codim));

  // Variable for returning (unique pointers to) child geometries
  std::vector<std::unique_ptr<Geometry>> child_geo_uptrs{};
  // For each child entity create a geometry object and a unique pointer to it.
  for (int l = 0; l < no_children; l++) {
    // A single child entity is described by a lattice polygon with
    // a certain number of corners
    LF_VERIFY_MSG(
        child_polygons[l].rows() == 2,
        "child_polygons[" << l << "].rows() = " << child_polygons[l].rows());
    // Obtain physical (world) coordinates of the vertices of
    // of the child entities after normalizing lattice coordinates
    const Eigen::MatrixXd child_geo(
        Global(h_lattice * child_polygons[l].cast<double>()));
    // Treat child entities of different dimension
    switch (codim) {
      case 0: {  // Child cells
        if (child_polygons[l].cols() == 3) {
          // Child cell is a triangle
          child_geo_uptrs.push_back(std::make_unique<TriaO1>(child_geo));
        } else if (child_polygons[l].cols() == 4) {
          // Child cell is a quadrilateral
          child_geo_uptrs.push_back(std::make_unique<QuadO1>(child_geo));
        } else {
          LF_VERIFY_MSG(false, "child_polygons[" << l << "].cols() = "
                                                 << child_polygons[l].cols());
        }
        break;
      }
      case 1: {
        // Child is an edge
        LF_VERIFY_MSG(
            child_polygons[l].cols() == 2,
            "child_polygons[l].cols() = " << child_polygons[l].cols());
        child_geo_uptrs.push_back(std::make_unique<SegmentO1>(child_geo));
        break;
      }
      case 2: {
        LF_VERIFY_MSG(
            child_polygons[l].cols() == 1,
            "child_polygons[l].cols() = " << child_polygons[l].cols());
        child_geo_uptrs.push_back(std::make_unique<Point>(child_geo));
        break;
      }
      default: {
        LF_VERIFY_MSG(false, "Illegal co-dimension");
        break;
      }
    }  // end switch codim
  }  // end loop over children
  return (child_geo_uptrs);
}